

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

DescriptorProto *
google::protobuf::Arena::CreateMaybeMessage<google::protobuf::DescriptorProto>(Arena *arena)

{
  DescriptorProto *this;
  
  if (arena == (Arena *)0x0) {
    this = (DescriptorProto *)operator_new(0xe8);
    DescriptorProto::DescriptorProto(this);
  }
  else {
    AllocHook(arena,(type_info *)&DescriptorProto::typeinfo,0xe8);
    this = (DescriptorProto *)internal::ArenaImpl::AllocateAligned(&arena->impl_,0xe8);
    DescriptorProto::DescriptorProto(this,arena);
  }
  return this;
}

Assistant:

static void InitDefaultsscc_info_SourceCodeInfo_google_2fprotobuf_2fdescriptor_2eproto() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  {
    void* ptr = &PROTOBUF_NAMESPACE_ID::_SourceCodeInfo_default_instance_;
    new (ptr) PROTOBUF_NAMESPACE_ID::SourceCodeInfo();
    ::PROTOBUF_NAMESPACE_ID::internal::OnShutdownDestroyMessage(ptr);
  }
  PROTOBUF_NAMESPACE_ID::SourceCodeInfo::InitAsDefaultInstance();
}